

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O3

void __thiscall
Network::Network(Network *this,uint Nnodes,
                vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                *links)

{
  pointer psVar1;
  key_type kVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  ulong uVar5;
  key_type local_54;
  allocator_type local_4e;
  allocator_type local_4d;
  allocator_type local_4c;
  key_equal local_4b;
  hash<unsigned_int> local_4a;
  allocator_type local_49;
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  *local_48;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  uVar4 = (ulong)Nnodes;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->node_list,uVar4,&local_49)
  ;
  local_40 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->backwards_list;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)local_40,uVar4,&local_4a,&local_4b,&local_4c);
  local_48 = &this->links;
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::vector(local_48,uVar4,&local_4d);
  local_38 = &this->triangle_count;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(local_38,uVar4,&local_4e);
  local_54 = 0;
  if (Nnodes != 0) {
    do {
      kVar2 = local_54;
      (this->node_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[local_54] = local_54;
      pmVar3 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](local_40,&local_54);
      *pmVar3 = kVar2;
      uVar4 = (ulong)local_54;
      psVar1 = (links->
               super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(links->
                     super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) *
              -0x5555555555555555;
      if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) {
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::operator=(&(local_48->
                     super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t,&psVar1[uVar4]._M_t);
      }
      local_54 = local_54 + 1;
    } while (local_54 < Nnodes);
  }
  check_consistency(this);
  compute_triangles(this);
  return;
}

Assistant:

Network(unsigned int Nnodes, std::vector<std::set<unsigned int> > links) :
            triangle_count(Nnodes), links(Nnodes), node_list(Nnodes), backwards_list(Nnodes) {

        for (unsigned int node_i = 0; node_i < Nnodes; node_i++) {
            node_list[node_i] = node_i;
            backwards_list[node_i] = node_i;
            if (node_i < links.size())
                this->links[node_i] = links[node_i];
        }

        check_consistency();
        compute_triangles();
    }